

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O0

WebPMuxError WebPMuxGetAnimationParams(WebPMux *mux,WebPMuxAnimParams *params)

{
  uint32_t uVar1;
  int iVar2;
  WebPData *in_RSI;
  long in_RDI;
  WebPMuxError err;
  WebPData anim;
  undefined4 in_stack_ffffffffffffffd0;
  long local_28;
  ulong local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  WebPMuxError WVar3;
  
  if ((in_RDI == 0) || (in_RSI == (WebPData *)0x0)) {
    WVar3 = WEBP_MUX_INVALID_ARGUMENT;
  }
  else {
    WVar3 = MuxGet((WebPMux *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   (CHUNK_INDEX)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,in_RSI);
    if (WVar3 == WEBP_MUX_OK) {
      if (local_20 < 6) {
        WVar3 = WEBP_MUX_BAD_DATA;
      }
      else {
        uVar1 = GetLE32((uint8_t *)CONCAT44(1,in_stack_ffffffffffffffd0));
        *(uint32_t *)&in_RSI->bytes = uVar1;
        iVar2 = GetLE16((uint8_t *)(local_28 + 4));
        *(int *)((long)&in_RSI->bytes + 4) = iVar2;
        WVar3 = WEBP_MUX_OK;
      }
    }
  }
  return WVar3;
}

Assistant:

WebPMuxError WebPMuxGetAnimationParams(const WebPMux* mux,
                                       WebPMuxAnimParams* params) {
  WebPData anim;
  WebPMuxError err;

  if (mux == NULL || params == NULL) return WEBP_MUX_INVALID_ARGUMENT;

  err = MuxGet(mux, IDX_ANIM, 1, &anim);
  if (err != WEBP_MUX_OK) return err;
  if (anim.size < kChunks[WEBP_CHUNK_ANIM].size) return WEBP_MUX_BAD_DATA;
  params->bgcolor = GetLE32(anim.bytes);
  params->loop_count = GetLE16(anim.bytes + 4);

  return WEBP_MUX_OK;
}